

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_ReadPublic(TSS_DEVICE *tpm,TPMI_DH_OBJECT objectHandle,TPM2B_PUBLIC *outPublic,
                      TPM2B_NAME *name,TPM2B_NAME *qualifiedName)

{
  TPM_RC TVar1;
  BYTE *paramBuf;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3068 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  LOGGER_LOG l;
  TPM2B_NAME *qualifiedName_local;
  TPM2B_NAME *name_local;
  TPM2B_PUBLIC *outPublic_local;
  TSS_DEVICE *pTStack_20;
  TPMI_DH_OBJECT objectHandle_local;
  TSS_DEVICE *tpm_local;
  
  outPublic_local._4_4_ = objectHandle;
  pTStack_20 = tpm;
  if (((outPublic == (TPM2B_PUBLIC *)0x0) || (name == (TPM2B_NAME *)0x0)) ||
     (qualifiedName == (TPM2B_NAME *)0x0)) {
    CmdCtx._12312_8_ = xlogging_get_log_function();
    if ((LOGGER_LOG)CmdCtx._12312_8_ != (LOGGER_LOG)0x0) {
      (*(code *)CmdCtx._12312_8_)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                 ,"TPM2_ReadPublic",0x41b,1,
                 "Invalid parameter outPublic: %p, name: %p, qualifiedName: %p",outPublic,name,
                 qualifiedName);
    }
    tpm_local._4_4_ = 0x101;
  }
  else {
    local_3068 = (undefined1  [4])0x0;
    TVar1 = TSS_DispatchCmd(tpm,0x173,(TPM_HANDLE *)((long)&outPublic_local + 4),1,
                            (TSS_SESSION **)0x0,0,(TSS_CMD_CONTEXT *)local_3068);
    tpm_local._4_4_ = TVar1;
    if (TVar1 == 0) {
      TVar1 = TPM2B_PUBLIC_Unmarshal
                        (outPublic,(BYTE **)(CmdCtx.RespBuffer + 0xffc),
                         (INT32 *)(CmdCtx.RespBuffer + 0xff8),1);
      if (TVar1 == 0) {
        TVar1 = TPM2B_NAME_Unmarshal
                          (name,(BYTE **)(CmdCtx.RespBuffer + 0xffc),
                           (INT32 *)(CmdCtx.RespBuffer + 0xff8));
        if (TVar1 == 0) {
          TVar1 = TPM2B_NAME_Unmarshal
                            (qualifiedName,(BYTE **)(CmdCtx.RespBuffer + 0xffc),
                             (INT32 *)(CmdCtx.RespBuffer + 0xff8));
          if (TVar1 != 0) {
            tpm_local._4_4_ = 0x9a;
          }
        }
        else {
          tpm_local._4_4_ = 0x9a;
        }
      }
      else {
        tpm_local._4_4_ = 0x9a;
      }
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_ReadPublic(
    TSS_DEVICE         *tpm,                    // IN/OUT
    TPMI_DH_OBJECT      objectHandle,           // IN
    TPM2B_PUBLIC       *outPublic,              // OUT
    TPM2B_NAME         *name,                   // OUT
    TPM2B_NAME         *qualifiedName           // OUT
)
{
    if (outPublic == NULL || name == NULL || qualifiedName == NULL)
    {
        LogError("Invalid parameter outPublic: %p, name: %p, qualifiedName: %p", outPublic, name, qualifiedName);
        return TPM_RC_FAILURE;
    }
    else
    {
        TSS_CMD_CONTEXT  CmdCtx;

        BEGIN_CMD();
        DISPATCH_CMD(ReadPublic, &objectHandle, 1, NULL, 0);
        TSS_UNMARSHAL_FLAGGED(TPM2B_PUBLIC, outPublic);
        TSS_UNMARSHAL(TPM2B_NAME, name);
        TSS_UNMARSHAL(TPM2B_NAME, qualifiedName);
        END_CMD();
    }
}